

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O0

bool __thiscall xercesc_4_0::CMStateSet::operator==(CMStateSet *this,CMStateSet *setToCompare)

{
  XMLInt32 **ppXVar1;
  XMLInt32 **ppXVar2;
  ulong local_48;
  XMLSize_t subIndex;
  XMLInt32 **mine;
  XMLInt32 **other;
  XMLSize_t index_1;
  XMLSize_t index;
  CMStateSet *setToCompare_local;
  CMStateSet *this_local;
  
  if (this->fBitCount == setToCompare->fBitCount) {
    if (this->fDynamicBuffer == (CMDynamicBuffer *)0x0) {
      for (index_1 = 0; index_1 < 4; index_1 = index_1 + 1) {
        if (this->fBits[index_1] != setToCompare->fBits[index_1]) {
          return false;
        }
      }
    }
    else {
      for (other = (XMLInt32 **)0x0; other < (XMLInt32 **)this->fDynamicBuffer->fArraySize;
          other = (XMLInt32 **)((long)other + 1)) {
        ppXVar2 = setToCompare->fDynamicBuffer->fBitArray + (long)other;
        ppXVar1 = this->fDynamicBuffer->fBitArray + (long)other;
        if ((*ppXVar1 != (XMLInt32 *)0x0) || (*ppXVar2 != (XMLInt32 *)0x0)) {
          if ((*ppXVar1 == (XMLInt32 *)0x0) || (*ppXVar2 == (XMLInt32 *)0x0)) {
            return false;
          }
          for (local_48 = 0; local_48 < 0x20; local_48 = local_48 + 1) {
            if ((*ppXVar1)[local_48] != (*ppXVar2)[local_48]) {
              return false;
            }
          }
        }
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator==(const CMStateSet& setToCompare) const
    {
        if (fBitCount != setToCompare.fBitCount)
            return false;

        if(fDynamicBuffer==0)
        {
            for (XMLSize_t index = 0; index < CMSTATE_CACHED_INT32_SIZE; index++)
            {
                if (fBits[index] != setToCompare.fBits[index])
                    return false;
            }
        }
        else
        {
            for (XMLSize_t index = 0; index < fDynamicBuffer->fArraySize; index++)
            {
                XMLInt32 *& other = setToCompare.fDynamicBuffer->fBitArray[index],
                         *& mine = fDynamicBuffer->fBitArray[index];
                if(mine==NULL && other==NULL)
                    continue;
                else if(mine==NULL || other==NULL) // the other should have been empty too
                    return false;
                else
                {
                    for(XMLSize_t subIndex = 0; subIndex < CMSTATE_BITFIELD_INT32_SIZE; subIndex++)
                        if(mine[subIndex]!=other[subIndex])
                            return false;
                }
            }
        }
        return true;
    }